

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environments.cpp
# Opt level: O2

bool fill_environment(shared_ptr<SchemeEnvironment> *env,shared_ptr<SchemePair> *np,
                     shared_ptr<SchemePair> *vp)

{
  element_type *peVar1;
  shared_ptr<SchemeSymbol> s;
  shared_ptr<SchemeObject> local_50;
  __shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  while( true ) {
    peVar1 = (np->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      return true;
    }
    if (peVar1 == (element_type *)
                  scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
      return true;
    }
    peVar1 = (vp->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      return true;
    }
    if (peVar1 == (element_type *)
                  scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    break;
    std::dynamic_pointer_cast<SchemeSymbol,SchemeObject>(&local_50);
    if (local_50.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_50.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      return false;
    }
    Context::set(&((env->super___shared_ptr<SchemeEnvironment,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->context,
                 (string *)
                 (local_50.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1),
                 &((vp->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->car);
    std::dynamic_pointer_cast<SchemePair,SchemeObject>((shared_ptr<SchemeObject> *)&local_40);
    std::__shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&np->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::dynamic_pointer_cast<SchemePair,SchemeObject>((shared_ptr<SchemeObject> *)&local_40);
    std::__shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&vp->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_50.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return true;
}

Assistant:

static bool fill_environment(const std::shared_ptr<SchemeEnvironment> &env, std::shared_ptr<SchemePair> np,
                             std::shared_ptr<SchemePair> vp)
{
    while(np && np != scheme_nil && vp && vp != scheme_nil)
    {
        auto s = std::dynamic_pointer_cast<SchemeSymbol>(np->car);
        if(!s)
            return false;
        env->context.set(s->value, vp->car);
        np = std::dynamic_pointer_cast<SchemePair>(np->cdr);
        vp = std::dynamic_pointer_cast<SchemePair>(vp->cdr);
    }
    return true;
}